

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_dirk.c
# Opt level: O2

char * ARKodeButcherTable_DIRKIDToName(ARKODE_DIRKTableID imethod)

{
  char *pcVar1;
  
  switch(imethod) {
  case ARKODE_MIN_DIRK_NUM:
    pcVar1 = "ARKODE_SDIRK_2_1_2";
    break;
  case ARKODE_BILLINGTON_3_3_2:
    pcVar1 = "ARKODE_BILLINGTON_3_3_2";
    break;
  case ARKODE_TRBDF2_3_3_2:
    pcVar1 = "ARKODE_TRBDF2_3_3_2";
    break;
  case ARKODE_KVAERNO_4_2_3:
    pcVar1 = "ARKODE_KVAERNO_4_2_3";
    break;
  case ARKODE_ARK324L2SA_DIRK_4_2_3:
    pcVar1 = "ARKODE_ARK324L2SA_DIRK_4_2_3";
    break;
  case ARKODE_CASH_5_2_4:
    pcVar1 = "ARKODE_CASH_5_2_4";
    break;
  case ARKODE_CASH_5_3_4:
    pcVar1 = "ARKODE_CASH_5_3_4";
    break;
  case ARKODE_SDIRK_5_3_4:
    pcVar1 = "ARKODE_SDIRK_5_3_4";
    break;
  case ARKODE_KVAERNO_5_3_4:
    pcVar1 = "ARKODE_KVAERNO_5_3_4";
    break;
  case ARKODE_ARK436L2SA_DIRK_6_3_4:
    pcVar1 = "ARKODE_ARK436L2SA_DIRK_6_3_4";
    break;
  case ARKODE_KVAERNO_7_4_5:
    pcVar1 = "ARKODE_KVAERNO_7_4_5";
    break;
  case ARKODE_ARK548L2SA_DIRK_8_4_5:
    pcVar1 = "ARKODE_ARK548L2SA_DIRK_8_4_5";
    break;
  case ARKODE_ARK437L2SA_DIRK_7_3_4:
    pcVar1 = "ARKODE_ARK437L2SA_DIRK_7_3_4";
    break;
  case ARKODE_ARK548L2SAb_DIRK_8_4_5:
    pcVar1 = "ARKODE_ARK548L2SAb_DIRK_8_4_5";
    break;
  case ARKODE_ESDIRK324L2SA_4_2_3:
    pcVar1 = "ARKODE_ESDIRK324L2SA_4_2_3";
    break;
  case ARKODE_ESDIRK325L2SA_5_2_3:
    pcVar1 = "ARKODE_ESDIRK325L2SA_5_2_3";
    break;
  case ARKODE_ESDIRK32I5L2SA_5_2_3:
    pcVar1 = "ARKODE_ESDIRK32I5L2SA_5_2_3";
    break;
  case ARKODE_ESDIRK436L2SA_6_3_4:
    pcVar1 = "ARKODE_ESDIRK436L2SA_6_3_4";
    break;
  case ARKODE_ESDIRK43I6L2SA_6_3_4:
    pcVar1 = "ARKODE_ESDIRK43I6L2SA_6_3_4";
    break;
  case ARKODE_QESDIRK436L2SA_6_3_4:
    pcVar1 = "ARKODE_QESDIRK436L2SA_6_3_4";
    break;
  case ARKODE_ESDIRK437L2SA_7_3_4:
    pcVar1 = "ARKODE_ESDIRK437L2SA_7_3_4";
    break;
  case ARKODE_ESDIRK547L2SA_7_4_5:
    pcVar1 = "ARKODE_ESDIRK547L2SA_7_4_5";
    break;
  case ARKODE_ESDIRK547L2SA2_7_4_5:
    pcVar1 = "ARKODE_ESDIRK547L2SA2_7_4_5";
    break;
  case ARKODE_ARK2_DIRK_3_1_2:
    pcVar1 = "ARKODE_ARK2_DIRK_3_1_2";
    break;
  case ARKODE_BACKWARD_EULER_1_1:
    pcVar1 = "ARKODE_BACKWARD_EULER_1_1";
    break;
  case ARKODE_IMPLICIT_MIDPOINT_1_2:
    pcVar1 = "ARKODE_IMPLICIT_MIDPOINT_1_2";
    break;
  case ARKODE_IMPLICIT_TRAPEZOIDAL_2_2:
    pcVar1 = "ARKODE_IMPLICIT_TRAPEZOIDAL_2_2";
    break;
  default:
    if (imethod == ARKODE_DIRK_NONE) {
      pcVar1 = "ARKODE_DIRK_NONE";
    }
    else {
      pcVar1 = (char *)0x0;
      arkProcessError((ARKodeMem)0x0,-0x16,0x49,"ARKodeButcherTable_DIRKIDToName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_butcher_dirk.c"
                      ,"Unknown Butcher table");
    }
  }
  return pcVar1;
}

Assistant:

const char* ARKodeButcherTable_DIRKIDToName(ARKODE_DIRKTableID imethod)
{
  /* Use X-macro to test each method name */
  switch (imethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: return #name;
#include "arkode_butcher_dirk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}